

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<384U,_unsigned_int,_void,_false>::rd_string
          (uintwide_t<384U,_unsigned_int,_void,_false> *this,char *str_input,
          unsigned_fast_type count,int base_hint)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  uintwide_t<384U,_unsigned_int,_void,_false> local_68;
  
  (this->values).super_array<unsigned_int,_12UL>.elems[8] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[9] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[10] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[0xb] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[4] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[5] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[6] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[7] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[0] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[1] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[2] = 0;
  (this->values).super_array<unsigned_int,_12UL>.elems[3] = 0;
  if (count == 0xffffffffffffffff) {
    if (*str_input == '\0') {
      count = 0;
    }
    else {
      uVar9 = 0;
      do {
        count = uVar9 + 1;
        lVar8 = uVar9 + 1;
        uVar9 = count;
      } while (str_input[lVar8] != '\0');
    }
  }
  uVar9 = 0;
  if (count != 0) {
    uVar9 = (ulong)(*str_input == '+');
  }
  bVar11 = false;
  if (count != 0) {
    bVar11 = *str_input == '-';
    uVar9 = uVar9 + bVar11;
  }
  if ((((char)base_hint == '\0') && (base_hint = 10, uVar9 < count)) && (str_input[uVar9] == '0')) {
    if ((byte)(str_input[uVar9 + 1] - 0x30U) < 9) {
      uVar9 = uVar9 + 1;
      base_hint = 8;
    }
    else if ((byte)(str_input[uVar9 + 1] | 0x20U) == 0x78) {
      uVar9 = uVar9 + 2;
      base_hint = 0x10;
    }
  }
  bVar10 = true;
  if (uVar9 < count) {
    do {
      bVar4 = str_input[uVar9];
      if (bVar4 != 0x27) {
        if ((char)base_hint == '\x10') {
          bVar6 = bVar4 - 0x30;
          bVar10 = (bVar6 < 10 || (byte)(bVar4 + 0xbf) < 6) || (byte)(bVar4 + 0x9f) < 6;
          if ((bVar6 < 10) ||
             ((bVar4 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar4 - 0x41) & 0x3f) & 1) != 0)))
             ) {
            if ((byte)(bVar4 + 0x9f) < 6) {
              bVar4 = bVar4 + 0xa9;
            }
            else if ((byte)(bVar4 + 0xbf) < 6) {
              bVar4 = bVar4 - 0x37;
            }
            else {
              bVar4 = bVar4 - 0x30;
              if (9 < bVar6) {
                bVar4 = 0;
              }
            }
            uVar7 = 0;
            lVar8 = 0;
            do {
              uVar3 = *(uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar8);
              *(uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar8) =
                   uVar3 << 4 | uVar7;
              lVar8 = lVar8 + 4;
              uVar7 = uVar3 >> 0x1c;
            } while (lVar8 != 0x30);
LAB_001afac3:
            (this->values).super_array<unsigned_int,_12UL>.elems[0] =
                 (this->values).super_array<unsigned_int,_12UL>.elems[0] | (uint)bVar4;
          }
        }
        else if ((base_hint & 0xffU) == 10) {
          bVar10 = (byte)(bVar4 - 0x30) < 10;
          if (bVar10) {
            lVar8 = 0;
            uVar5 = 0;
            do {
              uVar5 = uVar5 + (ulong)(this->values).super_array<unsigned_int,_12UL>.elems[lVar8] *
                              10;
              (this->values).super_array<unsigned_int,_12UL>.elems[lVar8] =
                   (value_type_conflict)uVar5;
              uVar5 = uVar5 >> 0x20;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0xc);
            local_68.values.super_array<unsigned_int,_12UL>.elems[2] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[3] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[8] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[9] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[10] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[0xb] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[4] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[5] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[6] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[7] = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems._1_7_ = 0;
            local_68.values.super_array<unsigned_int,_12UL>.elems[0]._0_1_ = bVar4 - 0x30;
            operator+=(this,&local_68);
          }
        }
        else if ((base_hint & 0xffU) == 8) {
          bVar4 = bVar4 - 0x30;
          bVar10 = bVar4 < 9;
          if (bVar10) {
            uVar7 = 0;
            lVar8 = 0;
            do {
              uVar3 = *(uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar8);
              *(uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar8) =
                   uVar7 + uVar3 * 8;
              lVar8 = lVar8 + 4;
              uVar7 = uVar3 >> 0x1d;
            } while (lVar8 != 0x30);
            goto LAB_001afac3;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 < count) && (bVar10 != false));
  }
  if (bVar11) {
    lVar8 = 0;
    do {
      puVar1 = (uint *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar8);
      *puVar1 = ~*puVar1;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x30);
    lVar8 = 0;
    do {
      piVar2 = (int *)((long)(this->values).super_array<unsigned_int,_12UL>.elems + lVar8);
      *piVar2 = *piVar2 + 1;
      if (*piVar2 != 0) {
        return bVar10;
      }
      bVar11 = lVar8 != 0x2c;
      lVar8 = lVar8 + 4;
    } while (bVar11);
  }
  return bVar10;
}

Assistant:

constexpr auto rd_string(const char* str_input, const unsigned_fast_type count, const int base_hint) -> bool // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
    {
      detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0)));

      const auto str_length =
        static_cast<unsigned_fast_type>
        (
          (count == (std::numeric_limits<unsigned_fast_type>::max)()) ? detail::strlen_unsafe(str_input) : count
        );

      auto pos = static_cast<unsigned_fast_type>(UINT8_C(0));

      // Detect: Is there a plus sign?
      // And if there is a plus sign, skip over the plus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '+')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        ++pos;
      }

      auto str_has_neg_sign = false;

      // Detect: Is there a minus sign?
      // And if there is a minus sign, skip over the minus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '-')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        str_has_neg_sign = true;

        ++pos;
      }

      // Set the base if the client has supplied a non-zero base-hint.
      auto base = static_cast<std::uint_fast8_t>(base_hint);

      if(base == static_cast<std::uint_fast8_t>(UINT8_C(0)))
      {
        base = static_cast<std::uint_fast8_t>(UINT8_C(10));

        // Perform a dynamic detection of the base.
        if(str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))
        {
          const auto might_be_oct_or_hex = ((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] == '0') && (str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

          if(might_be_oct_or_hex)
          {
            if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] <= '8')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is octal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(8));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)));
            }
            else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'x') || (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'X')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is hexadecimal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(16));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(2)));
            }
          }
          else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] <= '9')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          {
            // The input format is decimal.
            ;
          }
        }
      }

      auto char_is_valid = true;

      while((pos < str_length) && char_is_valid) // NOLINT(altera-id-dependent-backward-branch)
      {
        const auto c = str_input[pos++]; // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

        const auto char_is_apostrophe = (c == static_cast<char>(39));

        if(!char_is_apostrophe)
        {
          if(base == static_cast<std::uint_fast8_t>(UINT8_C(8)))
          {
            char_is_valid = ((c >= '0') && (c <= '8'));

            if(char_is_valid)
            {
              const auto uc_oct = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(3))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_oct);
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(10)))
          {
            char_is_valid = ((c >= '0') && (c <= '9'));

            if(char_is_valid)
            {
              const auto uc_dec = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(mul_by_limb(static_cast<limb_type>(UINT8_C(10))));

              static_cast<void>(operator+=(uc_dec));
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(16)))
          {
            const auto char_is_a_to_f_lo((c >= 'a') && (c <= 'f'));
            const auto char_is_a_to_f_hi((c >= 'A') && (c <= 'F'));
            const auto char_is_0_to_9   ((c >= '0') && (c <= '9'));

            char_is_valid = (char_is_a_to_f_lo || char_is_a_to_f_hi || char_is_0_to_9);

            if(char_is_valid)
            {
              auto uc_hex = static_cast<std::uint8_t>(UINT8_C(0));

              if     (char_is_a_to_f_lo) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  87))); }
              else if(char_is_a_to_f_hi) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  55))); }
              else if(char_is_0_to_9)    { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30))); }

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(4))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_hex);
            }
          }
        }
      }

      if(str_has_neg_sign)
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        negate(); // LCOV_EXCL_LINE
      }

      return char_is_valid;
    }